

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::AmrLevel::FillCoarsePatch
          (AmrLevel *this,MultiFab *mf,int dcomp,Real time,int idx,int scomp,int ncomp,int nghost)

{
  BoxArray *this_00;
  IntVect *pIVar1;
  Box *pBVar2;
  int *piVar3;
  int nvar;
  pointer pSVar4;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> amrlevel;
  element_type *peVar5;
  pointer pIVar6;
  undefined8 uVar7;
  bool bVar8;
  int i;
  StateDescriptor *this_01;
  long lVar9;
  long lVar10;
  DistributionMapping *a_ngrow;
  Geometry *geom_;
  InterpBase *mapper;
  ulong uVar11;
  IndexSpace *pIVar12;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs;
  int iVar13;
  StateData *this_02;
  ulong uVar14;
  initializer_list<int> __l;
  allocator_type local_341;
  ulong local_340;
  Real local_338;
  MultiFab *local_330;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> smf;
  int local_310;
  Vector<double,_std::allocator<double>_> stime;
  Box domain_g;
  StateDataPhysBCFunct physbcf;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> ranges;
  BoxArray crseBA;
  MultiFab crseMF;
  
  local_338 = time;
  this_01 = DescriptorList::operator[]((DescriptorList *)desc_lst,idx);
  lVar9 = (long)idx;
  pSVar4 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  amrlevel.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(long)this->level + -1]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  pBVar2 = &pSVar4[lVar9].domain;
  uVar7 = *(undefined8 *)((pBVar2->smallend).vect + 2);
  pIVar1 = &pSVar4[lVar9].domain.bigend;
  domain_g.bigend.vect[1] = (int)((ulong)*(undefined8 *)pIVar1->vect >> 0x20);
  domain_g._20_8_ = *(undefined8 *)(pIVar1->vect + 2);
  domain_g.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
  domain_g.smallend.vect[2] = (int)uVar7;
  domain_g.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    if (*(char *)((long)(this->geom).super_CoordSys.inv_dx + lVar10 + 0x19) == '\x01') {
      piVar3 = domain_g.smallend.vect + lVar10;
      *piVar3 = *piVar3 - nghost;
      piVar3 = domain_g.bigend.vect + lVar10;
      *piVar3 = *piVar3 + nghost;
    }
  }
  a_ngrow = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  geom_ = (Geometry *)
          ((long)amrlevel.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10);
  local_330 = mf;
  StateDescriptor::sameInterps(&ranges,this_01,scomp,ncomp);
  pIVar1 = &this->crse_ratio;
  lVar10 = 0;
  do {
    if ((int)((ulong)((long)ranges.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)ranges.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar10) {
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&ranges.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      return;
    }
    local_340 = (ulong)(uint)ranges.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar10].first;
    nvar = ranges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar10].second;
    mapper = StateDescriptor::interp
                       (this_01,ranges.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar10].first);
    peVar5 = (local_330->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    BoxArray::BoxArray(&crseBA,((long)(peVar5->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               *(long *)&(peVar5->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data) / 0x1c);
    uVar11 = ((long)((crseBA.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)((crseBA.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x1c;
    uVar14 = uVar11 & 0xffffffff;
    iVar13 = 0;
    if ((int)uVar11 < 1) {
      uVar14 = 0;
      iVar13 = 0;
    }
    for (; (int)uVar14 != iVar13; iVar13 = iVar13 + 1) {
      BoxArray::operator[]((Box *)&smf,this_00,iVar13);
      uVar11 = CONCAT44(-(uint)(domain_g.smallend.vect[1] <
                               smf.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_ - nghost),
                        -(uint)(domain_g.smallend.vect[0] <
                               (int)(smf.
                                     super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     .
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_ - nghost)));
      crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
           (_func_int **)
           (~uVar11 & domain_g.smallend.vect._0_8_ |
           CONCAT44(smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_ - nghost,
                    smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_ - nghost) & uVar11);
      crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           (int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_finish - nghost;
      if ((int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_finish - nghost <= domain_g.smallend.vect[2]) {
        crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
             domain_g.smallend.vect[2];
      }
      uVar11 = CONCAT44(-(uint)((int)smf.
                                     super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     .
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + nghost <
                               domain_g.bigend.vect[1]),
                        -(uint)(smf.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish._4_4_ + nghost <
                               domain_g.bigend.vect[0]));
      crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_8_ =
           ~uVar11 & CONCAT44(domain_g.bigend.vect[1],domain_g.bigend.vect[0]) |
           CONCAT44((int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + nghost,
                    smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_ + nghost) & uVar11;
      crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_crse_ratio.vect[0] =
           smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + nghost;
      if (domain_g.bigend.vect[2] <=
          smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ + nghost) {
        crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
        m_crse_ratio.vect[0] = domain_g.bigend.vect[2];
      }
      crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_crse_ratio.vect[1] = local_310;
      (*mapper->_vptr_InterpBase[3])
                ((MFInfo *)&smf,mapper,&crseMF.super_FabArray<amrex::FArrayBox>,pIVar1);
      BoxArray::set(&crseBA,iVar13,(Box *)&smf);
    }
    MultiFab::MultiFab((MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>);
    pIVar12 = EB2::TopIndexSpaceIfPresent();
    if (pIVar12 == (IndexSpace *)0x0) {
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 1;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)&PTR__FabFactory_006d8928;
      MultiFab::define((MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>,&crseBA,a_ngrow,nvar,0,
                       (MFInfo *)&smf,(FabFactory<amrex::FArrayBox> *)&stime);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._0_12_ =
           ZEXT812(0);
      __l._M_len = 3;
      __l._M_array = (iterator)&stime;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&smf,__l,&local_341);
      makeEBFabFactory((Geometry *)&physbcf,(BoxArray *)geom_,(DistributionMapping *)&crseBA,
                       (Vector<int,_std::allocator<int>_> *)a_ngrow,(EBSupport)(MFInfo *)&smf);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&smf);
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 1;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      MultiFab::define((MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>,&crseBA,a_ngrow,nvar,0,
                       (MFInfo *)&smf,(FabFactory<amrex::FArrayBox> *)physbcf.statedata);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (physbcf.statedata != (StateData *)0x0) {
        (*(code *)((physbcf.statedata)->m_factory)._M_t.
                  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                  [1]._vptr_FabFactory)();
      }
    }
    local_310 = 0;
    iVar13 = this->level;
    if ((long)iVar13 == 1) {
LAB_00480074:
      this_02 = (StateData *)
                (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                            ((long)amrlevel.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x170))->
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                lVar9 * 0xe0);
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      StateData::getData(this_02,&smf,&stime,local_338);
      StateDataPhysBCFunct::StateDataPhysBCFunct(&physbcf,this_02,(int)local_340,geom_);
      FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
                (&crseMF.super_FabArray<amrex::FArrayBox>,NAN,geom_);
      FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                ((MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>,local_338,&smf,&stime,
                 (int)local_340,0,nvar,geom_,&physbcf,(int)local_340);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&stime);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&smf);
    }
    else {
      pIVar6 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = BATransformer::index_type(&this_00->m_bat);
      bVar8 = ProperlyNested<amrex::InterpBase>
                        (pIVar1,pIVar6 + iVar13,nghost,(IndexType *)&smf,mapper);
      if (bVar8) goto LAB_00480074;
      FillPatch((AmrLevel *)
                amrlevel.
                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                (MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>,0,local_338,idx,(int)local_340,
                nvar,0);
    }
    smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = nghost;
    smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = nghost;
    smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = nghost;
    bcs = StateDescriptor::getBCs(this_01);
    FillPatchInterp<amrex::MultiFab>
              (local_330,dcomp,(MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>,0,nvar,
               (IntVect *)&smf,geom_,&this->geom,&domain_g,pIVar1,mapper,bcs,(int)local_340);
    if (0 < nghost) {
      iVar13 = (int)local_340;
      StateDataPhysBCFunct::StateDataPhysBCFunct
                ((StateDataPhysBCFunct *)&smf,
                 (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar9,iVar13,&this->geom);
      stime.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._0_12_ =
           *(undefined1 (*) [12])
            (local_330->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
      StateDataPhysBCFunct::operator()
                ((StateDataPhysBCFunct *)&smf,local_330,dcomp,nvar,(IntVect *)&stime,local_338,
                 iVar13);
    }
    dcomp = dcomp + nvar;
    MultiFab::~MultiFab((MultiFab *)&crseMF.super_FabArray<amrex::FArrayBox>);
    BoxArray::~BoxArray(&crseBA);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void
AmrLevel::FillCoarsePatch (MultiFab& mf,
                           int       dcomp,
                           Real      time,
                           int       idx,
                           int       scomp,
                           int       ncomp,
                           int       nghost)
{
    BL_PROFILE("AmrLevel::FillCoarsePatch()");

    //
    // Must fill this region on crse level and interpolate.
    //
    BL_ASSERT(level != 0);
    BL_ASSERT(ncomp <= (mf.nComp()-dcomp));
    BL_ASSERT(nghost <= mf.nGrow());
    BL_ASSERT(0 <= idx && idx < desc_lst.size());

    int                     DComp   = dcomp;
    const StateDescriptor&  desc    = desc_lst[idx];
    const Box&              pdomain = state[idx].getDomain();
    const BoxArray&         mf_BA   = mf.boxArray();
    const DistributionMapping& mf_DM = mf.DistributionMap();
    AmrLevel&               clev    = parent->getLevel(level-1);
    const Geometry&         cgeom   = clev.geom;

    Box domain_g = pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (geom.isPeriodic(i)) {
            domain_g.grow(i,nghost);
        }
    }

    std::vector< std::pair<int,int> > ranges  = desc.sameInterps(scomp,ncomp);

    BL_ASSERT(desc.inRange(scomp, ncomp));

    for (int i = 0; i < static_cast<int>(ranges.size()); i++)
    {
        const int     SComp  = ranges[i].first;
        const int     NComp  = ranges[i].second;
        InterpBase*   mapper = desc.interp(SComp);

        BoxArray crseBA(mf_BA.size());

        for (int j = 0, N = crseBA.size(); j < N; ++j)
        {
            BL_ASSERT(mf_BA[j].ixType() == desc.getType());
            const Box& bx = amrex::grow(mf_BA[j],nghost) & domain_g;
            crseBA.set(j,mapper->CoarseBox(bx, crse_ratio));
        }

        MultiFab crseMF;
#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            auto cfactory = makeEBFabFactory(cgeom, crseBA, mf_DM, {0,0,0}, EBSupport::basic);
            crseMF.define(crseBA,mf_DM,NComp,0,MFInfo(),*cfactory);
        } else
#endif
        {
            crseMF.define(crseBA,mf_DM,NComp,0);
        }

        if ( level == 1
             || amrex::ProperlyNested(crse_ratio, parent->blockingFactor(level),
                                      nghost, mf_BA.ixType(), mapper) )
        {
            StateData& statedata = clev.state[idx];

            Vector<MultiFab*> smf;
            Vector<Real> stime;
            statedata.getData(smf,stime,time);

            StateDataPhysBCFunct physbcf(statedata,SComp,cgeom);

            crseMF.setDomainBndry(std::numeric_limits<Real>::quiet_NaN(), cgeom);
            amrex::FillPatchSingleLevel(crseMF,time,smf,stime,SComp,0,NComp,cgeom,physbcf,SComp);
        }
        else
        {
            FillPatch(clev,crseMF,0,time,idx,SComp,NComp,0);
        }

        FillPatchInterp(mf, DComp, crseMF, 0, NComp, IntVect(nghost), cgeom, geom, domain_g,
                        crse_ratio, mapper, desc.getBCs(), SComp);

        if (nghost > 0) {
            StateDataPhysBCFunct physbcf(state[idx],SComp,geom);
            physbcf.FillBoundary(mf, DComp, NComp, mf.nGrowVect(), time, SComp);
        }

        DComp += NComp;
    }
}